

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O2

void __thiscall
Catch::TeamCityReporter::testGroupEnded(TeamCityReporter *this,TestGroupStats *testGroupStats)

{
  ostream *poVar1;
  string sStack_38;
  
  LazyStat<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentGroupInfo);
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream,
                           "##teamcity[testSuiteFinished name=\'");
  escape(&sStack_38,&(testGroupStats->groupInfo).name);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void testGroupEnded( TestGroupStats const& testGroupStats ) override {
            StreamingReporterBase::testGroupEnded( testGroupStats );
            stream << "##teamcity[testSuiteFinished name='"
                << escape( testGroupStats.groupInfo.name ) << "']\n";
        }